

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_twod_square_circle(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar14 = "create";
    uVar8 = 0x810;
    goto LAB_00122983;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  local_9c[1] = 1;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = 0;
  iVar5 = (int)(0x17 / (long)iVar6);
  iVar12 = iVar5 * iVar6;
  if (0x17 < iVar12) {
    iVar9 = ((((iVar6 + 0x17) / iVar6) * (iVar12 + -0x18)) / iVar5 - iVar12) + 0x18;
  }
  if (iVar7 == iVar9) {
LAB_00122a79:
    uVar4 = ref_node_add(ref_node,0,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x823,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x824,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.3333333333333333;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x825,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.6666666666666666;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,3,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x826,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x828,"ref_fixture_twod_square_circle",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar6 = (iVar6 + 0x17) / iVar6;
    iVar9 = 0;
    if (iVar6 + 1U < 3) {
      iVar9 = iVar6;
    }
    iVar12 = 0x18 - iVar12;
    if (iVar12 <= iVar9) {
      iVar9 = (1 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00122a79;
    iVar9 = (int)(2 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (2 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00122a79;
    iVar9 = (int)(3 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (3 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00122a79;
  }
  local_9c[1] = 2;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = (iVar6 + 0x17) / iVar6;
  iVar12 = (int)(3 / (long)iVar9);
  iVar5 = (int)(0x17 / (long)iVar6);
  iVar6 = 0x18 - iVar5 * iVar6;
  if (iVar6 <= iVar12) {
    iVar12 = (3 - iVar6 * iVar9) / iVar5 + iVar6;
  }
  if (iVar7 == iVar12) {
LAB_00123098:
    uVar4 = ref_node_add(ref_node,3,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x838,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,4,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x839,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3[lVar13 * 0xf + 1] = 0.3333333333333333;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,5,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x83a,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3[lVar13 * 0xf + 1] = 0.6666666666666666;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,6,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x83b,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x83d,"ref_fixture_twod_square_circle",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar12 = (int)(4 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (4 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00123098;
    iVar12 = (int)(5 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (5 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00123098;
    iVar12 = (int)(6 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (6 - iVar9 * iVar6) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00123098;
  }
  local_9c[1] = 3;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = (iVar6 + 0x17) / iVar6;
  iVar12 = (int)(6 / (long)iVar9);
  iVar5 = (int)(0x17 / (long)iVar6);
  iVar6 = 0x18 - iVar5 * iVar6;
  if (iVar6 <= iVar12) {
    iVar12 = (6 - iVar6 * iVar9) / iVar5 + iVar6;
  }
  if (iVar7 == iVar12) {
LAB_001236c8:
    uVar4 = ref_node_add(ref_node,6,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x84d,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,7,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x84e,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.6666666666666666;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,8,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x84f,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.3333333333333333;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,9,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x850,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x852,"ref_fixture_twod_square_circle",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar12 = (int)(7 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (7 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_001236c8;
    iVar12 = (int)(8 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (8 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_001236c8;
    iVar12 = (int)(9 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (9 - iVar9 * iVar6) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_001236c8;
  }
  local_9c[1] = 4;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = (iVar6 + 0x17) / iVar6;
  iVar12 = (int)(9 / (long)iVar9);
  iVar5 = (int)(0x17 / (long)iVar6);
  iVar6 = iVar5 * iVar6;
  iVar15 = 0x18 - iVar6;
  if (iVar15 <= iVar12) {
    iVar12 = (9 - iVar15 * iVar9) / iVar5 + iVar15;
  }
  if (iVar7 == iVar12) {
LAB_00123cf6:
    uVar4 = ref_node_add(ref_node,9,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x862,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,10,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x863,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 0.6666666666666666;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xb,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x864,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 0.3333333333333333;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x865,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x867,"ref_fixture_twod_square_circle",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar12 = (int)(10 / (long)iVar9);
    if (iVar15 <= iVar12) {
      iVar12 = (10 - iVar15 * iVar9) / iVar5 + iVar15;
    }
    if (iVar7 == iVar12) goto LAB_00123cf6;
    iVar12 = (int)(0xb / (long)iVar9);
    if (iVar15 <= iVar12) {
      iVar12 = (0xb - iVar15 * iVar9) / iVar5 + iVar15;
    }
    if (iVar7 == iVar12) goto LAB_00123cf6;
    iVar12 = 0;
    if (0x17 < iVar6) {
      iVar12 = (((iVar6 + -0x18) * iVar9) / iVar5 - iVar6) + 0x18;
    }
    if (iVar7 == iVar12) goto LAB_00123cf6;
  }
  local_9c[1] = 5;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = (iVar6 + 0x17) / iVar6;
  iVar12 = (int)(0xc / (long)iVar9);
  iVar5 = (int)(0x17 / (long)iVar6);
  iVar6 = 0x18 - iVar5 * iVar6;
  if (iVar6 <= iVar12) {
    iVar12 = (0xc - iVar6 * iVar9) / iVar5 + iVar6;
  }
  if (iVar7 == iVar12) {
LAB_00124321:
    uVar4 = ref_node_add(ref_node,0xc,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x878,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3[lVar13 * 0xf] = 0.75;
    pRVar3[lVar13 * 0xf + 1] = 0.4999999999999984;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xd,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x87a,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.7165063509461089;
    pRVar3[lVar13 * 0xf + 1] = 0.3749999999999987;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xe,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x87c,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.6249999999999989;
    pRVar3[lVar13 * 0xf + 1] = 0.2834936490538897;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xf,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x87e,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3[lVar13 * 0xf] = 0.49999999999999883;
    pRVar3[lVar13 * 0xf + 1] = 0.25;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x880,"ref_fixture_twod_square_circle",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar12 = (int)(0xd / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0xd - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124321;
    iVar12 = (int)(0xe / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0xe - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124321;
    iVar12 = (int)(0xf / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0xf - iVar9 * iVar6) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124321;
  }
  local_9c[1] = 6;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = (iVar6 + 0x17) / iVar6;
  iVar12 = (int)(0xf / (long)iVar9);
  iVar5 = (int)(0x17 / (long)iVar6);
  iVar6 = 0x18 - iVar5 * iVar6;
  if (iVar6 <= iVar12) {
    iVar12 = (0xf - iVar6 * iVar9) / iVar5 + iVar6;
  }
  if (iVar7 == iVar12) {
LAB_00124989:
    uVar4 = ref_node_add(ref_node,0xf,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x891,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3[lVar13 * 0xf] = 0.49999999999999883;
    pRVar3[lVar13 * 0xf + 1] = 0.25;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x10,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x893,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.37499999999999895;
    pRVar3[lVar13 * 0xf + 1] = 0.28349364905389096;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x11,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x895,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.2834936490538899;
    pRVar3[lVar13 * 0xf + 1] = 0.3750000000000007;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x12,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x897,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3[lVar13 * 0xf] = 0.25;
    pRVar3[lVar13 * 0xf + 1] = 0.5000000000000008;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x899,"ref_fixture_twod_square_circle",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar12 = (int)(0x10 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0x10 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124989;
    iVar12 = (int)(0x11 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0x11 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124989;
    iVar12 = (int)(0x12 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0x12 - iVar9 * iVar6) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124989;
  }
  local_9c[1] = 7;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = (iVar6 + 0x17) / iVar6;
  iVar12 = (int)(0x12 / (long)iVar9);
  iVar5 = (int)(0x17 / (long)iVar6);
  iVar6 = 0x18 - iVar5 * iVar6;
  if (iVar6 <= iVar12) {
    iVar12 = (0x12 - iVar6 * iVar9) / iVar5 + iVar6;
  }
  if (iVar7 == iVar12) {
LAB_00124fe7:
    uVar4 = ref_node_add(ref_node,0x12,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8aa,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3[lVar13 * 0xf] = 0.25;
    pRVar3[lVar13 * 0xf + 1] = 0.5000000000000008;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x13,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8ac,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.28349364905389063;
    pRVar3[lVar13 * 0xf + 1] = 0.6250000000000006;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x14,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8ae,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.37500000000000056;
    pRVar3[lVar13 * 0xf + 1] = 0.7165063509461099;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x15,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8b0,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3[lVar13 * 0xf] = 0.5000000000000004;
    pRVar3[lVar13 * 0xf + 1] = 0.75;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8b2,"ref_fixture_twod_square_circle",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar12 = (int)(0x13 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0x13 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124fe7;
    iVar12 = (int)(0x14 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0x14 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124fe7;
    iVar12 = (int)(0x15 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0x15 - iVar9 * iVar6) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00124fe7;
  }
  local_9c[1] = 8;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = (iVar6 + 0x17) / iVar6;
  iVar12 = (int)(0x15 / (long)iVar9);
  iVar5 = (int)(0x17 / (long)iVar6);
  iVar6 = 0x18 - iVar5 * iVar6;
  if (iVar6 <= iVar12) {
    iVar12 = (0x15 - iVar6 * iVar9) / iVar5 + iVar6;
  }
  if (iVar7 == iVar12) {
LAB_0012564f:
    uVar4 = ref_node_add(ref_node,0x15,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8c3,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3[lVar13 * 0xf] = 0.5000000000000004;
    pRVar3[lVar13 * 0xf + 1] = 0.75;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x16,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8c5,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.6250000000000002;
    pRVar3[lVar13 * 0xf + 1] = 0.7165063509461095;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x17,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8c7,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.7165063509461097;
    pRVar3[lVar13 * 0xf + 1] = 0.6249999999999999;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xc,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8c9,"ref_fixture_twod_square_circle",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3[lVar13 * 0xf] = 0.75;
    pRVar3[lVar13 * 0xf + 1] = 0.5;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 0x17) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(0x17 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(0x17 / (long)iVar6);
      iVar6 = 0x18 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8cb,"ref_fixture_twod_square_circle",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar12 = (int)(0x16 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0x16 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_0012564f;
    iVar12 = (int)(0x17 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0x17 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_0012564f;
    iVar12 = (int)(0xc / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (0xc - iVar9 * iVar6) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_0012564f;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,0x18);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar14 = "init glob";
  uVar8 = 0x8ce;
LAB_00122983:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_twod_square_circle",(ulong)uVar4,pcVar14);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_square_circle(REF_GRID *ref_grid_ptr,
                                                  REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 24;
  REF_DBL x0 = 0.5, y0 = 0.5, r = 0.25, t;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  local[4] = 1;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0 / 3.0, 0.0, 0.0);
    add_that_node(2, 2.0 / 3.0, 0.0, 0.0);
    add_that_node(3, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  local[4] = 2;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 0.0, 0.0);
    add_that_node(1, 1.0, 1.0 / 3.0, 0.0);
    add_that_node(2, 1.0, 2.0 / 3.0, 0.0);
    add_that_node(3, 1.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 6;
  global[1] = 7;
  global[2] = 8;
  global[3] = 9;
  local[4] = 3;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 1.0, 0.0);
    add_that_node(1, 2.0 / 3.0, 1.0, 0.0);
    add_that_node(2, 1.0 / 3.0, 1.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 9;
  global[1] = 10;
  global[2] = 11;
  global[3] = 0;
  local[4] = 4;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 1.0, 0.0);
    add_that_node(1, 0.0, 2.0 / 3.0, 0.0);
    add_that_node(2, 0.0, 1.0 / 3.0, 0.0);
    add_that_node(3, 0.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 12;
  global[1] = 13;
  global[2] = 14;
  global[3] = 15;
  local[4] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (12.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (11.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (10.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (9.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 15;
  global[1] = 16;
  global[2] = 17;
  global[3] = 18;
  local[4] = 6;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (9.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (8.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (7.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (6.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 18;
  global[1] = 19;
  global[2] = 20;
  global[3] = 21;
  local[4] = 7;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (6.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (5.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (4.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (3.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 21;
  global[1] = 22;
  global[2] = 23;
  global[3] = 12;
  local[4] = 8;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (3.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (2.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (1.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (0.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}